

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  i64 iVar1;
  Fts5Structure *pFVar2;
  long in_RDI;
  Fts5Index *in_stack_fffffffffffffff8;
  
  if (*(long *)(in_RDI + 0xa0) == 0) {
    iVar1 = fts5IndexDataVersion(in_stack_fffffffffffffff8);
    *(i64 *)(in_RDI + 0x98) = iVar1;
    if (*(int *)(in_RDI + 0x3c) == 0) {
      pFVar2 = fts5StructureReadUncached(in_stack_fffffffffffffff8);
      *(Fts5Structure **)(in_RDI + 0xa0) = pFVar2;
    }
  }
  if (*(int *)(in_RDI + 0x3c) == 0) {
    fts5StructureRef(*(Fts5Structure **)(in_RDI + 0xa0));
    pFVar2 = *(Fts5Structure **)(in_RDI + 0xa0);
  }
  else {
    pFVar2 = (Fts5Structure *)0x0;
  }
  return pFVar2;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}